

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::GlobalModuleField::~GlobalModuleField(GlobalModuleField *this)

{
  Expr *pEVar1;
  pointer pcVar2;
  _func_int ***ppp_Var3;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__GlobalModuleField_00198a78;
  pEVar1 = (this->global).init_expr.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var3 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  (this->global).init_expr.first_ = (Expr *)0x0;
  (this->global).init_expr.last_ = (Expr *)0x0;
  (this->global).init_expr.size_ = 0;
  pcVar2 = (this->global).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == &(this->global).name.field_2) {
    return;
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

explicit GlobalModuleField(const Location& loc = Location(),
                             string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Global>(loc), global(name) {}